

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBox.h
# Opt level: O1

string * __thiscall
adios2::kvcache::QueryBox::toString_abi_cxx11_(string *__return_storage_ptr__,QueryBox *this)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  string __str;
  char *local_58;
  uint local_50;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Start_","");
  if ((this->Start).super_CoreDims.DimCount != 0) {
    uVar6 = 0;
    do {
      uVar1 = (this->Start).super_CoreDims.DimensSpan[uVar6];
      cVar5 = '\x01';
      if (9 < uVar1) {
        uVar4 = uVar1;
        cVar3 = '\x04';
        do {
          cVar5 = cVar3;
          if (uVar4 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_00478bed;
          }
          if (uVar4 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_00478bed;
          }
          if (uVar4 < 10000) goto LAB_00478bed;
          bVar2 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar3 = cVar5 + '\x04';
        } while (bVar2);
        cVar5 = cVar5 + '\x01';
      }
LAB_00478bed:
      local_58 = local_48;
      std::__cxx11::string::_M_construct((ulong)&local_58,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,uVar1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (uVar6 != (this->Start).super_CoreDims.DimCount - 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->Start).super_CoreDims.DimCount);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->Start).super_CoreDims.DimCount != 0) {
    uVar6 = 0;
    do {
      uVar1 = (this->Count).super_CoreDims.DimensSpan[uVar6];
      cVar5 = '\x01';
      if (9 < uVar1) {
        uVar4 = uVar1;
        cVar3 = '\x04';
        do {
          cVar5 = cVar3;
          if (uVar4 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_00478cce;
          }
          if (uVar4 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_00478cce;
          }
          if (uVar4 < 10000) goto LAB_00478cce;
          bVar2 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar3 = cVar5 + '\x04';
        } while (bVar2);
        cVar5 = cVar5 + '\x01';
      }
LAB_00478cce:
      local_58 = local_48;
      std::__cxx11::string::_M_construct((ulong)&local_58,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,uVar1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if (uVar6 != (this->Start).super_CoreDims.DimCount - 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (this->Start).super_CoreDims.DimCount);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        std::string str = "Start_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Start[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|Count_";
        for (size_t i = 0; i < Start.size(); ++i)
        {
            str += std::to_string(Count[i]);
            if (i != Start.size() - 1)
            {
                str += "_";
            }
        }
        str += "|";
        return str;
    }